

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O3

void __thiscall TSPStateImp::InitData(TSPStateImp *this)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  int j;
  ulong uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  std::istream::operator>>((istream *)&std::cin,&this->n);
  uVar8 = (ulong)this->n;
  uVar4 = 0xffffffffffffffff;
  if (-1 < (long)uVar8) {
    uVar4 = uVar8 * 8;
  }
  pdVar3 = (double *)operator_new__(uVar4);
  this->x = pdVar3;
  pdVar3 = (double *)operator_new__(uVar4);
  this->y = pdVar3;
  if (0 < (long)uVar8) {
    lVar6 = 0;
    do {
      std::istream::_M_extract<double>((double *)&std::cin);
      lVar6 = lVar6 + 1;
      uVar8 = (ulong)this->n;
    } while (lVar6 < (long)uVar8);
    if (0 < this->n) {
      lVar6 = 0;
      do {
        std::istream::_M_extract<double>((double *)&std::cin);
        lVar6 = lVar6 + 1;
        uVar8 = (ulong)this->n;
      } while (lVar6 < (long)uVar8);
    }
  }
  iVar7 = (int)uVar8;
  pdVar3 = (double *)operator_new__((ulong)(uint)(iVar7 * iVar7) << 3);
  this->adjacencyMatrix = pdVar3;
  if (0 < iVar7) {
    pdVar1 = this->x;
    pdVar2 = this->y;
    uVar8 = uVar8 & 0xffffffff;
    uVar4 = 0;
    do {
      uVar5 = 0;
      do {
        dVar9 = pdVar1[uVar4] - pdVar1[uVar5];
        dVar10 = pdVar2[uVar4] - pdVar2[uVar5];
        pdVar3[uVar5] = SQRT(dVar9 * dVar9 + dVar10 * dVar10);
        uVar5 = uVar5 + 1;
      } while (uVar8 != uVar5);
      uVar4 = uVar4 + 1;
      pdVar3 = pdVar3 + uVar8;
    } while (uVar4 != uVar8);
  }
  return;
}

Assistant:

void TSPStateImp::InitData()
{
	std::cin >> n;
	x = new double[n];
	y = new double[n];

	for (int i = 0; i < n; ++i)
		std::cin >> x[i];

	for (int j = 0; j < n; ++j)
		std::cin >> y[j];

	adjacencyMatrix = new double[n * n];

	for (int i = 0; i < n; ++i)
		for (int j = 0; j < n; ++j)
			adjacencyMatrix[i * n + j] = sqrt((x[i] - x[j]) * (x[i] - x[j]) + (y[i] - y[j]) * (y[i] - y[j]));
}